

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::APITest2::verifyGLGetActiveSubroutineUniformNameFunctionality
          (APITest2 *this)

{
  int iVar1;
  deUint32 dVar2;
  size_t sVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  GLchar *pGVar8;
  MessageBuilder local_4b8;
  MessageBuilder local_338;
  int local_1b8 [4];
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLsizei reported_length;
  Functions *gl;
  APITest2 *pAStack_10;
  GLsizei expected_length;
  APITest2 *this_local;
  
  pAStack_10 = this;
  sVar3 = strlen(this->m_subroutine_uniform_name);
  gl._4_4_ = (int)sVar3;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x740))(this->m_po_id,0x8b31,0,0,0);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGetActiveSubroutineUniformName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x812);
  (**(code **)(lStack_20 + 0x740))(this->m_po_id,0x8b31,0,0,&local_24,0);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGetActiveSubroutineUniformName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x817);
  if (local_24 != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [56])"Invalid active subroutine uniform name length reported:");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", instead of: ");
    local_1b8[0] = 0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1b8);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Incorrect length of active subroutine uniform name",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x821);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGVar8 = (GLchar *)operator_new__((long)(gl._4_4_ + 1));
  this->m_buffer = pGVar8;
  memset(this->m_buffer,0,(long)(gl._4_4_ + 1));
  (**(code **)(lStack_20 + 0x740))(this->m_po_id,0x8b31,0,gl._4_4_ + 1,&local_24,this->m_buffer);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"getActiveSubroutineUniformName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x829);
  if (local_24 != gl._4_4_) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_338,
                        (char (*) [56])"Invalid active subroutine uniform name length reported:");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", instead of: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&gl + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Incorrect length of active subroutine uniform name",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x831);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar1 = strcmp(this->m_buffer,this->m_subroutine_uniform_name);
  if (iVar1 != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4b8,
                        (char (*) [50])"Invalid active subroutine uniform name reported:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_buffer);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] instead of:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_subroutine_uniform_name);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid active subroutine uniform name reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x83b);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (this->m_buffer != (GLchar *)0x0) {
    operator_delete__(this->m_buffer);
  }
  this->m_buffer = (GLchar *)0x0;
  return;
}

Assistant:

void APITest2::verifyGLGetActiveSubroutineUniformNameFunctionality()
{
	GLsizei				  expected_length = (GLsizei)strlen(m_subroutine_uniform_name);
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	GLsizei				  reported_length = 0;

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
									  0,							/* bufsize */
									  DE_NULL,						/* length */
									  DE_NULL);						/* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineUniformName() call failed.");

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
									  0,							/* bufsize */
									  &reported_length, DE_NULL);   /* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineUniformName() call failed.");

	// reported_length is the actual number of characters written into <name>
	// If <bufSize> is 0, reported_length should be 0
	if (reported_length != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine uniform name length reported:" << reported_length
						   << ", instead of: " << 0 << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine uniform name");
	}

	m_buffer = new glw::GLchar[expected_length + 1];

	memset(m_buffer, 0, expected_length + 1);

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, 0, expected_length + 1, &reported_length, m_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformName() call failed.");

	if (reported_length != expected_length)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine uniform name length reported:" << reported_length
						   << ", instead of: " << expected_length << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine uniform name");
	}

	if (strcmp(m_buffer, m_subroutine_uniform_name) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid active subroutine uniform name reported:[" << m_buffer
						   << "]"
							  " instead of:["
						   << m_subroutine_uniform_name << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid active subroutine uniform name reported.");
	}

	delete[] m_buffer;
	m_buffer = DE_NULL;
}